

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

int32_t io_compareRows(void *context,void *left,void *right)

{
  long lVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  char *chars;
  TempAliasTable *tempTable;
  char strippedRight [60];
  char strippedLeft [60];
  void *right_local;
  void *left_local;
  void *context_local;
  
  lVar1 = *context;
  __s1 = (char *)(**(code **)((long)context + 0x18))
                           (strippedRight + 0x38,lVar1 + (int)((uint)*left << 1));
  __s2 = (char *)(**(code **)((long)context + 0x18))(&tempTable,lVar1 + (int)((uint)*right << 1));
  iVar2 = strcmp(__s1,__s2);
  return iVar2;
}

Assistant:

static int32_t U_CALLCONV
io_compareRows(const void *context, const void *left, const void *right) {
    char strippedLeft[UCNV_MAX_CONVERTER_NAME_LENGTH],
         strippedRight[UCNV_MAX_CONVERTER_NAME_LENGTH];

    TempAliasTable *tempTable=(TempAliasTable *)context;
    const char *chars=tempTable->chars;

    return (int32_t)uprv_strcmp(tempTable->stripForCompare(strippedLeft, chars+2*((const TempRow *)left)->strIndex),
                                tempTable->stripForCompare(strippedRight, chars+2*((const TempRow *)right)->strIndex));
}